

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterCloseDocCallback(void *context)

{
  xmlParserErrors error;
  int val;
  char *msg;
  int iVar1;
  
  iVar1 = 0;
  val = 1;
  error = xmlParseChunk((xmlParserCtxtPtr)context,(char *)0x0,0,1);
  if (error != XML_ERR_OK) {
    xmlWriterErrMsgInt((xmlTextWriterPtr)"xmlTextWriterCloseDocCallback : XML error %d !\n",error,
                       msg,val);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int
xmlTextWriterCloseDocCallback(void *context)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) context;
    int rc;

    if ((rc = xmlParseChunk(ctxt, NULL, 0, 1)) != 0) {
        xmlWriterErrMsgInt(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterCloseDocCallback : XML error %d !\n",
                        rc);
        return -1;
    }

    return 0;
}